

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricDecoderGetDecodableMetricsExpPrologue
          (ZETHandleLifetimeValidation *this,zet_metric_decoder_exp_handle_t hMetricDecoder,
          uint32_t *pCount,zet_metric_handle_t *phMetrics)

{
  bool bVar1;
  ze_result_t zVar2;
  
  bVar1 = HandleLifetimeValidation::isHandleValid<_zet_metric_decoder_exp_handle_t*>
                    (*(HandleLifetimeValidation **)(context + 0xd48),hMetricDecoder);
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar1) {
    zVar2 = ZE_RESULT_SUCCESS;
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricDecoderGetDecodableMetricsExpPrologue(
        zet_metric_decoder_exp_handle_t hMetricDecoder, ///< [in] handle of the metric decoder object
        uint32_t* pCount,                               ///< [in,out] pointer to number of decodable metric in the hMetricDecoder
                                                        ///< handle. If count is zero, then the driver shall 
                                                        ///< update the value with the total number of decodable metrics available
                                                        ///< in the decoder. if count is greater than zero 
                                                        ///< but less than the total number of decodable metrics available in the
                                                        ///< decoder, then only that number will be returned. 
                                                        ///< if count is greater than the number of decodable metrics available in
                                                        ///< the decoder, then the driver shall update the 
                                                        ///< value with the actual number of decodable metrics available. 
        zet_metric_handle_t* phMetrics                  ///< [in,out] [range(0, *pCount)] array of handles of decodable metrics in
                                                        ///< the hMetricDecoder handle provided.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hMetricDecoder )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }